

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

int CombinedH264Reader::getPrefixLen(uint8_t *pos,uint8_t *end)

{
  int iVar1;
  
  if ((((long)end - (long)pos < 4) || (*pos != '\0')) || (pos[1] != '\0')) {
    return 0;
  }
  if (pos[2] == '\x01') {
    iVar1 = 3;
  }
  else {
    if (pos[2] != '\0') {
      return 0;
    }
    if (pos[3] != '\x01') {
      return 0;
    }
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

int CombinedH264Reader::getPrefixLen(const uint8_t* pos, const uint8_t* end)
{
    if (end - pos < 4)
        return 0;
    if (pos[0] == 0 && pos[1] == 0)
    {
        if (pos[2] == 0 && pos[3] == 1)
            return 4;
        if (pos[2] == 1)
            return 3;
    }
    return 0;
}